

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.c
# Opt level: O2

cf_int64_t cf_clock_current_ns(cf_clock_t *self)

{
  int iVar1;
  cf_int64_t cVar2;
  timespec ts;
  
  iVar1 = clock_gettime((uint)((self->field_0x8 & 3) != 0),(timespec *)&ts);
  if (iVar1 == -1) {
    cVar2 = -1;
  }
  else {
    cVar2 = ts.tv_sec * 1000000000 + ts.tv_nsec;
  }
  return cVar2;
}

Assistant:

cf_int64_t cf_clock_current_ns(cf_clock_t* self) {
#ifdef CF_OS_WIN
    // https://docs.microsoft.com/en-us/windows/win32/sysinfo/acquiring-high-resolution-time-stamps
    LARGE_INTEGER clock_result, freq_result;
    ULONGLONG tick_ms;
    if (self->steady_high_flag) {
        if (_G_WIN_QPC_FREQ_ == 0) {
            if (!QueryPerformanceFrequency(&freq_result)) {
                return -1;
            }
            _G_WIN_QPC_FREQ_ = freq_result.QuadPart;
        }
        
        if (!QueryPerformanceCounter(&clock_result)) {
            return -1;
        }
        return 1000000000 * CF_TYPE_CAST(cf_int64_t, clock_result.QuadPart / _G_WIN_QPC_FREQ_);
    } else if (self->steady_flag) {
        tick_ms = GetTickCount64();
        return 1000000 * CF_TYPE_CAST(cf_int64_t, tick_ms);
    } else {
        return -1;
    }
#else
    struct timespec ts;
    if (self->steady_high_flag || self->steady_flag) {
        if (clock_gettime(CLOCK_MONOTONIC, &ts) == -1) {
            return -1;
        }
    } else {
        if (clock_gettime(CLOCK_REALTIME, &ts) == -1) {
            return -1;
        }
    }
    return 1000000000 * CF_TYPE_CAST(cf_int64_t, ts.tv_sec) + ts.tv_nsec;
#endif
}